

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

ExprNode * parse_expr(ParserState *ps)

{
  Token TVar1;
  size_t sVar2;
  ExprNode *pEVar3;
  ExprNode *en;
  ExprNode **ppEVar4;
  void *pvVar5;
  char *ptr;
  size_t subexprs_size;
  size_t local_38;
  
  pEVar3 = parse_atom(ps);
  if (pEVar3 == (ExprNode *)0x0) {
    pEVar3 = (ExprNode *)0x0;
  }
  else {
    TVar1 = ps->tok;
    if ((TVar1 & ~TOK_RPAR) == TOK_AND) {
      pvVar5 = (pEVar3->text).ptr;
      sVar2 = (pEVar3->text).len;
      en = (ExprNode *)safemalloc(1,0x28,0);
      *(undefined8 *)en = 0;
      (en->text).ptr = (void *)0x0;
      (en->text).len = 0;
      (en->field_2).field_0.subexprs = (ExprNode **)0x0;
      (en->field_2).field_0.nsubexprs = 0;
      en->op = (uint)(TVar1 != TOK_AND);
      (en->text).ptr = pvVar5;
      (en->text).len = sVar2;
      local_38 = 0;
      ppEVar4 = (ExprNode **)
                safegrowarray((en->field_2).field_0.subexprs,&local_38,8,
                              (en->field_2).field_0.nsubexprs,1,false);
      (en->field_2).field_0.subexprs = ppEVar4;
      sVar2 = (en->field_2).field_0.nsubexprs;
      (en->field_2).field_0.nsubexprs = sVar2 + 1;
      ppEVar4[sVar2] = pEVar3;
      do {
        advance(ps);
        pEVar3 = parse_atom(ps);
        if (pEVar3 == (ExprNode *)0x0) goto LAB_001040a9;
        ppEVar4 = (ExprNode **)
                  safegrowarray((en->field_2).field_0.subexprs,&local_38,8,
                                (en->field_2).field_0.nsubexprs,1,false);
        (en->field_2).field_0.subexprs = ppEVar4;
        sVar2 = (en->field_2).field_0.nsubexprs;
        (en->field_2).field_0.nsubexprs = sVar2 + 1;
        ppEVar4[sVar2] = pEVar3;
        pvVar5 = (void *)((long)(pEVar3->text).ptr + (pEVar3->text).len);
        if (pvVar5 < (en->text).ptr) {
          __assert_fail("end >= start",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/misc.h",
                        0xbb,"ptrlen make_ptrlen_startend(const void *, const void *)");
        }
        (en->text).len = (long)pvVar5 - (long)(en->text).ptr;
        if ((ps->tok & ~TOK_RPAR) != TOK_AND) {
          return en;
        }
      } while (ps->tok == TVar1);
      ptr = dupstr("expected parentheses to disambiguate && and || on either side of expression");
      if (ps->err == (char *)0x0) {
        pvVar5 = (pEVar3->text).ptr;
        sVar2 = (pEVar3->text).len;
        ps->err = ptr;
        (ps->errloc).ptr = pvVar5;
        (ps->errloc).len = sVar2;
      }
      else {
        safefree(ptr);
      }
LAB_001040a9:
      exprnode_free(en);
      pEVar3 = (ExprNode *)0x0;
    }
  }
  return pEVar3;
}

Assistant:

static ExprNode *parse_expr(ParserState *ps)
{
    ExprNode *subexpr = parse_atom(ps);
    if (!subexpr)
        return NULL;

    if (ps->tok != TOK_AND && ps->tok != TOK_OR)
        return subexpr;

    Token operator = ps->tok;
    ExprNode *en = exprnode_new(ps->tok == TOK_AND ? OP_AND : OP_OR,
                                subexpr->text);
    size_t subexprs_size = 0;

    sgrowarray(en->subexprs, subexprs_size, en->nsubexprs);
    en->subexprs[en->nsubexprs++] = subexpr;

    while (true) {
        advance(ps);                   /* eat the operator */

        subexpr = parse_atom(ps);
        if (!subexpr) {
            exprnode_free(en);
            return NULL;
        }
        sgrowarray(en->subexprs, subexprs_size, en->nsubexprs);
        en->subexprs[en->nsubexprs++] = subexpr;
        en->text = make_ptrlen_startend(
            en->text.ptr, ptrlen_end(subexpr->text));

        if (ps->tok != TOK_AND && ps->tok != TOK_OR)
            return en;

        if (ps->tok != operator) {
            error(ps, dupstr("expected parentheses to disambiguate && and || "
                             "on either side of expression"), subexpr->text);
            exprnode_free(en);
            return NULL;
        }
    }
}